

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBar::setNativeMenuBar(QMenuBar *this,bool nativeMenuBar)

{
  bool bVar1;
  QMenuBarPrivate *pQVar2;
  QPlatformTheme *pQVar3;
  QPlatformMenuBar *pQVar4;
  QWidget *pQVar5;
  byte in_SIL;
  QWidget *in_RDI;
  QMenuBarPrivate *d;
  
  bVar1 = (bool)(in_SIL & 1);
  pQVar2 = d_func((QMenuBar *)0x660205);
  if (bVar1 != (pQVar2->platformMenuBar != (QPlatformMenuBar *)0x0)) {
    if (bVar1 == false) {
      if (pQVar2->platformMenuBar != (QPlatformMenuBar *)0x0) {
        (**(code **)(*(long *)pQVar2->platformMenuBar + 0x20))();
      }
      pQVar2->platformMenuBar = (QPlatformMenuBar *)0x0;
      (pQVar2->super_QWidgetPrivate).field_0x254 =
           (pQVar2->super_QWidgetPrivate).field_0x254 & 0xfe | 1;
    }
    else if (pQVar2->platformMenuBar == (QPlatformMenuBar *)0x0) {
      pQVar3 = QGuiApplicationPrivate::platformTheme();
      pQVar4 = (QPlatformMenuBar *)(**(code **)(*(long *)pQVar3 + 0x20))();
      pQVar2->platformMenuBar = pQVar4;
    }
    QWidget::updateGeometry(in_RDI);
    if ((bVar1 == false) &&
       (pQVar5 = QWidget::parentWidget((QWidget *)0x6602ca), pQVar5 != (QWidget *)0x0)) {
      (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,1);
    }
  }
  return;
}

Assistant:

void QMenuBar::setNativeMenuBar(bool nativeMenuBar)
{
    Q_D(QMenuBar);
    if (nativeMenuBar != bool(d->platformMenuBar)) {
        if (!nativeMenuBar) {
            delete d->platformMenuBar;
            d->platformMenuBar = nullptr;
            d->itemsDirty = true;
        } else {
            if (!d->platformMenuBar)
                d->platformMenuBar = QGuiApplicationPrivate::platformTheme()->createPlatformMenuBar();
        }

        updateGeometry();
        if (!nativeMenuBar && parentWidget())
            setVisible(true);
    }
}